

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_avx512::create_pipeline(InnerProduct_x86_avx512 *this,Option *opt)

{
  Mat *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int *piVar5;
  Allocator *pAVar6;
  size_t sVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  int iVar21;
  int iVar22;
  uint _w;
  Layer *pLVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  void *pvVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  long lVar34;
  undefined1 (*pauVar35) [64];
  undefined4 *puVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  undefined4 *puVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  ulong uVar49;
  long lVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  ParamDict pd;
  void *local_1a0;
  void *local_198;
  void *local_190;
  void *local_188;
  void *local_180;
  void *local_178;
  void *local_170;
  void *local_168;
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  long local_128;
  uint local_110;
  Mat local_100;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  void *local_80;
  void *local_78;
  Mat *local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  pLVar23 = create_layer_cpu(0xe);
  this->flatten = pLVar23;
  ParamDict::ParamDict((ParamDict *)&local_100);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_100);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_100);
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar22 = cpu_support_x86_f16c();
  if ((iVar22 != 0) && (opt->use_fp16_storage == true)) {
    create_pipeline_fp16s(this,opt);
    return 0;
  }
  uVar33 = (this->super_InnerProduct).num_output;
  uVar49 = (ulong)uVar33;
  iVar22 = (this->super_InnerProduct).weight_data_size;
  _w = iVar22 / (int)uVar33;
  local_70 = &(this->super_InnerProduct).weight_data;
  if (opt->use_packing_layout == true) {
    this_00 = &this->weight_data_tm;
    if ((uVar33 & 0xf) == 0) {
      Mat::reshape(&local_100,local_70,_w,uVar33,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)uVar33 >> 4,0x40,0x10,(Allocator *)0x0);
      if (0xf < (int)uVar33) {
        lVar31 = 1;
        lVar44 = 10;
        local_88 = 9;
        local_90 = 8;
        local_98 = 7;
        local_a0 = 6;
        local_a8 = 5;
        local_b0 = 4;
        local_b8 = 3;
        lVar37 = 2;
        lVar43 = 0xd;
        lVar48 = 0xf;
        lVar24 = 0xe;
        lVar28 = 0xb;
        uVar38 = 0;
        lVar30 = 0xc;
        do {
          local_58 = lVar30;
          local_68 = uVar38;
          local_60 = lVar28;
          local_48 = lVar24;
          local_40 = lVar48;
          local_50 = lVar43;
          local_38 = lVar37;
          pauVar35 = (undefined1 (*) [64])
                     ((long)(this->weight_data_tm).w * (local_68 >> 4) *
                      (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          lVar37 = (long)local_100.w;
          if ((int)_w < 0x10) {
            lVar37 = local_100.elemsize * lVar37;
            local_168 = (void *)(lVar37 * local_68 + (long)local_100.data);
            local_160 = (void *)((local_68 | 1) * lVar37 + (long)local_100.data);
            pvVar29 = (void *)((local_68 | 2) * lVar37 + (long)local_100.data);
            local_188 = (void *)((local_68 | 3) * lVar37 + (long)local_100.data);
            local_198 = (void *)((local_68 | 4) * lVar37 + (long)local_100.data);
            local_158 = (void *)((local_68 | 5) * lVar37 + (long)local_100.data);
            local_170 = (void *)((local_68 | 6) * lVar37 + (long)local_100.data);
            local_190 = (void *)((local_68 | 7) * lVar37 + (long)local_100.data);
            local_1a0 = (void *)((local_68 | 8) * lVar37 + (long)local_100.data);
            local_140 = (void *)((local_68 | 9) * lVar37 + (long)local_100.data);
            local_148 = (void *)((local_68 | 10) * lVar37 + (long)local_100.data);
            local_150 = (void *)((local_68 | 0xb) * lVar37 + (long)local_100.data);
            local_178 = (void *)((local_68 | 0xc) * lVar37 + (long)local_100.data);
            local_78 = (void *)((local_68 | 0xd) * lVar37 + (long)local_100.data);
            local_180 = (void *)((local_68 | 0xe) * lVar37 + (long)local_100.data);
            local_80 = (void *)(lVar37 * (local_68 | 0xf) + (long)local_100.data);
            uVar33 = 0;
          }
          else {
            lVar27 = local_100.elemsize * local_68 * lVar37;
            lVar47 = local_100.elemsize * lVar31 * lVar37;
            lVar43 = local_100.elemsize * local_38 * lVar37;
            lVar24 = local_100.elemsize * local_40 * lVar37;
            lVar28 = local_100.elemsize * local_48 * lVar37;
            lVar46 = local_100.elemsize * local_50 * lVar37;
            lVar30 = local_100.elemsize * local_58 * lVar37;
            lVar32 = local_100.elemsize * local_60 * lVar37;
            lVar34 = local_100.elemsize * lVar44 * lVar37;
            lVar42 = local_100.elemsize * local_88 * lVar37;
            lVar45 = local_100.elemsize * local_90 * lVar37;
            lVar48 = local_100.elemsize * local_98 * lVar37;
            lVar25 = local_100.elemsize * local_a0 * lVar37;
            lVar50 = local_100.elemsize * local_a8 * lVar37;
            lVar26 = local_100.elemsize * local_b0 * lVar37;
            lVar37 = local_100.elemsize * local_b8 * lVar37;
            iVar22 = 0xf;
            local_188 = local_100.data;
            do {
              auVar75 = *(undefined1 (*) [64])((long)local_188 + lVar27);
              auVar76 = *(undefined1 (*) [64])((long)local_188 + lVar47);
              auVar77 = *(undefined1 (*) [64])((long)local_188 + lVar43);
              auVar78 = *(undefined1 (*) [64])((long)local_188 + lVar37);
              auVar79 = *(undefined1 (*) [64])((long)local_188 + lVar26);
              auVar80 = *(undefined1 (*) [64])((long)local_188 + lVar50);
              auVar81 = *(undefined1 (*) [64])((long)local_188 + lVar25);
              auVar82 = *(undefined1 (*) [64])((long)local_188 + lVar48);
              auVar74 = *(undefined1 (*) [64])((long)local_188 + lVar45);
              auVar83 = *(undefined1 (*) [64])((long)local_188 + lVar42);
              auVar84 = *(undefined1 (*) [64])((long)local_188 + lVar34);
              auVar85 = *(undefined1 (*) [64])((long)local_188 + lVar32);
              auVar63 = *(undefined1 (*) [64])((long)local_188 + lVar30);
              auVar64 = *(undefined1 (*) [64])((long)local_188 + lVar46);
              auVar65 = *(undefined1 (*) [64])((long)local_188 + lVar28);
              auVar66 = *(undefined1 (*) [64])((long)local_188 + lVar24);
              auVar62 = vunpcklps_avx512f(auVar75,auVar76);
              auVar75 = vunpckhps_avx512f(auVar75,auVar76);
              auVar76 = vunpcklps_avx512f(auVar77,auVar78);
              auVar77 = vunpckhps_avx512f(auVar77,auVar78);
              auVar78 = vunpcklps_avx512f(auVar79,auVar80);
              auVar79 = vunpckhps_avx512f(auVar79,auVar80);
              auVar80 = vunpcklps_avx512f(auVar81,auVar82);
              auVar81 = vunpckhps_avx512f(auVar81,auVar82);
              auVar82 = vunpcklps_avx512f(auVar74,auVar83);
              auVar74 = vunpckhps_avx512f(auVar74,auVar83);
              auVar83 = vunpcklps_avx512f(auVar84,auVar85);
              auVar84 = vunpckhps_avx512f(auVar84,auVar85);
              auVar85 = vunpcklps_avx512f(auVar63,auVar64);
              auVar63 = vunpckhps_avx512f(auVar63,auVar64);
              auVar64 = vunpcklps_avx512f(auVar65,auVar66);
              auVar65 = vunpckhps_avx512f(auVar65,auVar66);
              auVar66 = vunpcklpd_avx512f(auVar62,auVar76);
              auVar76 = vunpckhpd_avx512f(auVar62,auVar76);
              auVar62 = vunpcklpd_avx512f(auVar75,auVar77);
              auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
              auVar77 = vunpcklpd_avx512f(auVar78,auVar80);
              auVar78 = vunpckhpd_avx512f(auVar78,auVar80);
              auVar80 = vunpcklpd_avx512f(auVar79,auVar81);
              auVar79 = vunpckhpd_avx512f(auVar79,auVar81);
              auVar81 = vunpcklpd_avx512f(auVar82,auVar83);
              auVar82 = vunpckhpd_avx512f(auVar82,auVar83);
              auVar83 = vunpcklpd_avx512f(auVar74,auVar84);
              auVar74 = vunpckhpd_avx512f(auVar74,auVar84);
              auVar84 = vunpcklpd_avx512f(auVar85,auVar64);
              auVar85 = vunpckhpd_avx512f(auVar85,auVar64);
              auVar64 = vunpcklpd_avx512f(auVar63,auVar65);
              auVar63 = vunpckhpd_avx512f(auVar63,auVar65);
              auVar65 = vshuff64x2_avx512f(auVar66,auVar77,0x88);
              auVar67 = vshuff64x2_avx512f(auVar81,auVar84,0x88);
              auVar68 = vshuff64x2_avx512f(auVar76,auVar78,0x88);
              auVar69 = vshuff64x2_avx512f(auVar82,auVar85,0x88);
              auVar70 = vshuff64x2_avx512f(auVar62,auVar80,0x88);
              auVar71 = vshuff64x2_avx512f(auVar83,auVar64,0x88);
              auVar72 = vshuff64x2_avx512f(auVar75,auVar79,0x88);
              auVar73 = vshuff64x2_avx512f(auVar74,auVar63,0x88);
              auVar77 = vshuff64x2_avx512f(auVar66,auVar77,0xdd);
              auVar81 = vshuff64x2_avx512f(auVar81,auVar84,0xdd);
              auVar76 = vshuff64x2_avx512f(auVar76,auVar78,0xdd);
              auVar78 = vshuff64x2_avx512f(auVar82,auVar85,0xdd);
              auVar80 = vshuff64x2_avx512f(auVar62,auVar80,0xdd);
              auVar82 = vshuff64x2_avx512f(auVar83,auVar64,0xdd);
              auVar75 = vshuff64x2_avx512f(auVar75,auVar79,0xdd);
              auVar79 = vshuff64x2_avx512f(auVar74,auVar63,0xdd);
              auVar74 = vshuff64x2_avx512f(auVar65,auVar67,0x88);
              auVar83 = vshuff64x2_avx512f(auVar68,auVar69,0x88);
              auVar84 = vshuff64x2_avx512f(auVar70,auVar71,0x88);
              auVar85 = vshuff64x2_avx512f(auVar72,auVar73,0x88);
              auVar63 = vshuff64x2_avx512f(auVar77,auVar81,0x88);
              auVar64 = vshuff64x2_avx512f(auVar76,auVar78,0x88);
              auVar66 = vshuff64x2_avx512f(auVar80,auVar82,0x88);
              auVar62 = vshuff64x2_avx512f(auVar75,auVar79,0x88);
              auVar65 = vshuff64x2_avx512f(auVar65,auVar67,0xdd);
              auVar67 = vshuff64x2_avx512f(auVar68,auVar69,0xdd);
              auVar68 = vshuff64x2_avx512f(auVar70,auVar71,0xdd);
              auVar69 = vshuff64x2_avx512f(auVar72,auVar73,0xdd);
              auVar77 = vshuff64x2_avx512f(auVar77,auVar81,0xdd);
              auVar76 = vshuff64x2_avx512f(auVar76,auVar78,0xdd);
              auVar78 = vshuff64x2_avx512f(auVar80,auVar82,0xdd);
              auVar75 = vshuff64x2_avx512f(auVar75,auVar79,0xdd);
              *pauVar35 = auVar74;
              pauVar35[1] = auVar83;
              pauVar35[2] = auVar84;
              pauVar35[3] = auVar85;
              pauVar35[4] = auVar63;
              pauVar35[5] = auVar64;
              pauVar35[6] = auVar66;
              pauVar35[7] = auVar62;
              pauVar35[8] = auVar65;
              pauVar35[9] = auVar67;
              pauVar35[10] = auVar68;
              pauVar35[0xb] = auVar69;
              pauVar35[0xc] = auVar77;
              pauVar35[0xd] = auVar76;
              pauVar35[0xe] = auVar78;
              pauVar35[0xf] = auVar75;
              pauVar35 = pauVar35 + 0x10;
              local_188 = (void *)((long)local_188 + 0x40);
              iVar22 = iVar22 + 0x10;
            } while (iVar22 < (int)_w);
            local_168 = (void *)(lVar27 + (long)local_188);
            local_160 = (void *)(lVar47 + (long)local_188);
            pvVar29 = (void *)(lVar43 + (long)local_188);
            local_80 = (void *)(lVar24 + (long)local_188);
            local_180 = (void *)(lVar28 + (long)local_188);
            local_78 = (void *)(lVar46 + (long)local_188);
            local_178 = (void *)(lVar30 + (long)local_188);
            local_150 = (void *)(lVar32 + (long)local_188);
            local_148 = (void *)(lVar34 + (long)local_188);
            local_140 = (void *)(lVar42 + (long)local_188);
            local_1a0 = (void *)(lVar45 + (long)local_188);
            local_190 = (void *)(lVar48 + (long)local_188);
            local_170 = (void *)(lVar25 + (long)local_188);
            local_158 = (void *)(lVar50 + (long)local_188);
            local_198 = (void *)(lVar26 + (long)local_188);
            local_188 = (void *)(lVar37 + (long)local_188);
            uVar33 = _w & 0xfffffff0;
          }
          if ((int)(uVar33 | 7) < (int)_w) {
            lVar37 = 0;
            uVar40 = uVar33;
            do {
              auVar51 = vunpcklps_avx512vl(*(undefined1 (*) [32])((long)local_168 + lVar37),
                                           *(undefined1 (*) [32])((long)local_160 + lVar37));
              auVar17 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_168 + lVar37),
                                      *(undefined1 (*) [32])((long)local_160 + lVar37));
              auVar19 = vunpcklps_avx(*(undefined1 (*) [32])((long)pvVar29 + lVar37),
                                      *(undefined1 (*) [32])((long)local_188 + lVar37));
              auVar8 = vunpckhps_avx(*(undefined1 (*) [32])((long)pvVar29 + lVar37),
                                     *(undefined1 (*) [32])((long)local_188 + lVar37));
              auVar61 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_198 + lVar37),
                                      *(undefined1 (*) [32])((long)local_158 + lVar37));
              auVar9 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_198 + lVar37),
                                     *(undefined1 (*) [32])((long)local_158 + lVar37));
              auVar86 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_170 + lVar37),
                                      *(undefined1 (*) [32])((long)local_190 + lVar37));
              auVar10 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_170 + lVar37),
                                      *(undefined1 (*) [32])((long)local_190 + lVar37));
              auVar87 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_1a0 + lVar37),
                                      *(undefined1 (*) [32])((long)local_140 + lVar37));
              auVar11 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_1a0 + lVar37),
                                      *(undefined1 (*) [32])((long)local_140 + lVar37));
              auVar88 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_148 + lVar37),
                                      *(undefined1 (*) [32])((long)local_150 + lVar37));
              auVar12 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_148 + lVar37),
                                      *(undefined1 (*) [32])((long)local_150 + lVar37));
              auVar16 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_178 + lVar37),
                                      *(undefined1 (*) [32])((long)local_78 + lVar37));
              auVar18 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_178 + lVar37),
                                      *(undefined1 (*) [32])((long)local_78 + lVar37));
              auVar54 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_180 + lVar37),
                                      *(undefined1 (*) [32])((long)local_80 + lVar37));
              auVar13 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_180 + lVar37),
                                      *(undefined1 (*) [32])((long)local_80 + lVar37));
              auVar52 = vunpcklpd_avx512vl(auVar51,auVar19);
              auVar51 = vunpckhpd_avx512vl(auVar51,auVar19);
              auVar53 = vunpcklpd_avx512vl(auVar17,auVar8);
              auVar17 = vunpckhpd_avx(auVar17,auVar8);
              auVar19 = vunpcklpd_avx(auVar61,auVar86);
              auVar8 = vunpckhpd_avx(auVar61,auVar86);
              auVar61 = vunpcklpd_avx(auVar9,auVar10);
              auVar9 = vunpckhpd_avx(auVar9,auVar10);
              auVar86 = vunpcklpd_avx(auVar87,auVar88);
              auVar10 = vunpckhpd_avx(auVar87,auVar88);
              auVar87 = vunpcklpd_avx(auVar11,auVar12);
              auVar11 = vunpckhpd_avx(auVar11,auVar12);
              auVar88 = vunpcklpd_avx(auVar16,auVar54);
              auVar12 = vunpckhpd_avx(auVar16,auVar54);
              auVar16 = vunpcklpd_avx(auVar18,auVar13);
              auVar18 = vunpckhpd_avx(auVar18,auVar13);
              auVar89._16_16_ = auVar19._0_16_;
              auVar89._0_16_ = auVar52._0_16_;
              auVar54 = vinsertf32x4_avx512vl(auVar86,auVar88._0_16_,1);
              auVar55 = vinsertf32x4_avx512vl(auVar51,auVar8._0_16_,1);
              auVar56 = vinsertf32x4_avx512vl(auVar10,auVar12._0_16_,1);
              auVar57 = vinsertf32x4_avx512vl(auVar53,auVar61._0_16_,1);
              auVar58 = vinsertf32x4_avx512vl(auVar87,auVar16._0_16_,1);
              auVar59 = vinsertf32x4_avx512vl(auVar17,auVar9._0_16_,1);
              auVar60 = vinsertf32x4_avx512vl(auVar11,auVar18._0_16_,1);
              auVar13 = vperm2f128_avx(auVar52,auVar19,0x31);
              auVar19 = vperm2f128_avx(auVar86,auVar88,0x31);
              auVar8 = vperm2f128_avx(auVar51,auVar8,0x31);
              auVar10 = vperm2f128_avx(auVar10,auVar12,0x31);
              auVar61 = vshuff64x2_avx512vl(auVar53,auVar61,3);
              auVar12 = vperm2f128_avx(auVar87,auVar16,0x31);
              auVar17 = vperm2f128_avx(auVar17,auVar9,0x31);
              auVar9 = vperm2f128_avx(auVar11,auVar18,0x31);
              *(undefined1 (*) [32])*pauVar35 = auVar89;
              *(undefined1 (*) [32])((long)*pauVar35 + 0x20) = auVar54;
              *(undefined1 (*) [32])pauVar35[1] = auVar55;
              *(undefined1 (*) [32])(pauVar35[1] + 0x20) = auVar56;
              *(undefined1 (*) [32])pauVar35[2] = auVar57;
              *(undefined1 (*) [32])(pauVar35[2] + 0x20) = auVar58;
              *(undefined1 (*) [32])pauVar35[3] = auVar59;
              *(undefined1 (*) [32])(pauVar35[3] + 0x20) = auVar60;
              *(undefined1 (*) [32])pauVar35[4] = auVar13;
              *(undefined1 (*) [32])(pauVar35[4] + 0x20) = auVar19;
              *(undefined1 (*) [32])pauVar35[5] = auVar8;
              *(undefined1 (*) [32])(pauVar35[5] + 0x20) = auVar10;
              *(undefined1 (*) [32])pauVar35[6] = auVar61;
              *(undefined1 (*) [32])(pauVar35[6] + 0x20) = auVar12;
              *(undefined1 (*) [32])pauVar35[7] = auVar17;
              *(undefined1 (*) [32])(pauVar35[7] + 0x20) = auVar9;
              pauVar35 = pauVar35 + 8;
              uVar33 = uVar40 + 8;
              lVar37 = lVar37 + 0x20;
              iVar22 = uVar40 + 0xf;
              uVar40 = uVar33;
            } while (iVar22 < (int)_w);
            local_168 = (void *)((long)local_168 + lVar37);
            local_160 = (void *)((long)local_160 + lVar37);
            pvVar29 = (void *)((long)pvVar29 + lVar37);
            local_80 = (void *)((long)local_80 + lVar37);
            local_180 = (void *)((long)local_180 + lVar37);
            local_78 = (void *)((long)local_78 + lVar37);
            local_178 = (void *)((long)local_178 + lVar37);
            local_150 = (void *)((long)local_150 + lVar37);
            local_148 = (void *)((long)local_148 + lVar37);
            local_140 = (void *)((long)local_140 + lVar37);
            local_1a0 = (void *)((long)local_1a0 + lVar37);
            local_190 = (void *)((long)local_190 + lVar37);
            local_170 = (void *)((long)local_170 + lVar37);
            local_158 = (void *)((long)local_158 + lVar37);
            local_198 = (void *)((long)local_198 + lVar37);
            local_188 = (void *)((long)local_188 + lVar37);
          }
          if ((int)uVar33 < (int)_w) {
            lVar37 = 0;
            do {
              *(undefined4 *)*pauVar35 = *(undefined4 *)((long)local_168 + lVar37 * 4);
              *(undefined4 *)((long)*pauVar35 + 4) = *(undefined4 *)((long)local_160 + lVar37 * 4);
              *(undefined4 *)((long)*pauVar35 + 8) = *(undefined4 *)((long)pvVar29 + lVar37 * 4);
              *(undefined4 *)((long)*pauVar35 + 0xc) = *(undefined4 *)((long)local_188 + lVar37 * 4)
              ;
              *(undefined4 *)((long)*pauVar35 + 0x10) =
                   *(undefined4 *)((long)local_198 + lVar37 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x14) =
                   *(undefined4 *)((long)local_158 + lVar37 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x18) =
                   *(undefined4 *)((long)local_170 + lVar37 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x1c) =
                   *(undefined4 *)((long)local_190 + lVar37 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x20) =
                   *(undefined4 *)((long)local_1a0 + lVar37 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x24) =
                   *(undefined4 *)((long)local_140 + lVar37 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x28) =
                   *(undefined4 *)((long)local_148 + lVar37 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x2c) =
                   *(undefined4 *)((long)local_150 + lVar37 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x30) =
                   *(undefined4 *)((long)local_178 + lVar37 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x34) = *(undefined4 *)((long)local_78 + lVar37 * 4)
              ;
              *(undefined4 *)((long)*pauVar35 + 0x38) =
                   *(undefined4 *)((long)local_180 + lVar37 * 4);
              *(undefined4 *)((long)*pauVar35 + 0x3c) = *(undefined4 *)((long)local_80 + lVar37 * 4)
              ;
              pauVar35 = pauVar35 + 1;
              lVar37 = lVar37 + 1;
            } while (_w - uVar33 != (int)lVar37);
          }
          lVar31 = lVar31 + 0x10;
          lVar44 = lVar44 + 0x10;
          local_88 = local_88 + 0x10;
          local_90 = local_90 + 0x10;
          local_98 = local_98 + 0x10;
          local_a0 = local_a0 + 0x10;
          local_a8 = local_a8 + 0x10;
          local_b0 = local_b0 + 0x10;
          local_b8 = local_b8 + 0x10;
          lVar37 = local_38 + 0x10;
          lVar43 = local_50 + 0x10;
          lVar48 = local_40 + 0x10;
          lVar24 = local_48 + 0x10;
          lVar28 = local_60 + 0x10;
          uVar38 = local_68 + 0x10;
          lVar30 = local_58 + 0x10;
        } while (local_68 + 0x1f < uVar49);
      }
      if (local_100.refcount == (int *)0x0) goto LAB_002b380f;
      LOCK();
      *local_100.refcount = *local_100.refcount + -1;
      UNLOCK();
      if (*local_100.refcount != 0) goto LAB_002b380f;
      if (local_100.allocator != (Allocator *)0x0) {
        (*(local_100.allocator)->_vptr_Allocator[3])();
        goto LAB_002b380f;
      }
    }
    else if ((uVar33 & 7) == 0) {
      Mat::reshape(&local_100,local_70,_w,uVar33,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)uVar33 >> 3,0x20,8,(Allocator *)0x0);
      if (7 < (int)uVar33) {
        local_110 = _w & 0xfffffff0;
        lVar24 = 7;
        lVar48 = 6;
        lVar37 = 5;
        lVar43 = 4;
        local_158 = (void *)0x3;
        local_160 = (void *)0x2;
        local_168 = (void *)0x1;
        local_128 = 0;
        uVar38 = 0;
        do {
          lVar28 = (long)(this->weight_data_tm).w;
          pvVar29 = (this->weight_data_tm).data;
          sVar7 = (this->weight_data_tm).elemsize;
          puVar41 = (undefined4 *)((uVar38 >> 3) * lVar28 * sVar7 + (long)pvVar29);
          lVar30 = (long)local_100.w;
          if ((int)_w < 0x10) {
            lVar30 = local_100.elemsize * lVar30;
            lVar47 = lVar30 * uVar38;
            lVar32 = (uVar38 | 1) * lVar30;
            lVar27 = (uVar38 | 2) * lVar30;
            lVar26 = (uVar38 | 3) * lVar30;
            lVar25 = (uVar38 | 4) * lVar30;
            lVar34 = (uVar38 | 5) * lVar30;
            lVar44 = (uVar38 | 6) * lVar30;
            lVar31 = lVar30 * (uVar38 | 7);
            uVar33 = 0;
          }
          else {
            lVar31 = local_100.elemsize * lVar24 * lVar30;
            lVar44 = local_100.elemsize * lVar48 * lVar30;
            lVar34 = local_100.elemsize * lVar37 * lVar30;
            lVar25 = local_100.elemsize * lVar43 * lVar30;
            lVar26 = local_100.elemsize * (long)local_158 * lVar30;
            lVar27 = local_100.elemsize * (long)local_160 * lVar30;
            lVar32 = local_100.elemsize * (long)local_168 * lVar30;
            lVar30 = local_100.elemsize * uVar38 * lVar30;
            lVar28 = sVar7 * local_128 * lVar28;
            iVar22 = 0xf;
            lVar47 = 0;
            do {
              auVar75 = *(undefined1 (*) [64])((long)local_100.data + lVar47 + lVar30);
              auVar76 = *(undefined1 (*) [64])((long)local_100.data + lVar47 + lVar32);
              auVar77 = *(undefined1 (*) [64])((long)local_100.data + lVar47 + lVar27);
              auVar78 = *(undefined1 (*) [64])((long)local_100.data + lVar47 + lVar26);
              auVar79 = *(undefined1 (*) [64])((long)local_100.data + lVar47 + lVar25);
              auVar80 = *(undefined1 (*) [64])((long)local_100.data + lVar47 + lVar34);
              auVar81 = *(undefined1 (*) [64])((long)local_100.data + lVar47 + lVar44);
              auVar82 = *(undefined1 (*) [64])((long)local_100.data + lVar47 + lVar31);
              auVar74 = vunpcklps_avx512f(auVar75,auVar76);
              auVar75 = vunpckhps_avx512f(auVar75,auVar76);
              auVar76 = vunpcklps_avx512f(auVar77,auVar78);
              auVar77 = vunpckhps_avx512f(auVar77,auVar78);
              auVar78 = vunpcklps_avx512f(auVar79,auVar80);
              auVar79 = vunpckhps_avx512f(auVar79,auVar80);
              auVar80 = vunpcklps_avx512f(auVar81,auVar82);
              auVar81 = vunpckhps_avx512f(auVar81,auVar82);
              auVar82 = vunpcklpd_avx512f(auVar74,auVar76);
              auVar76 = vunpckhpd_avx512f(auVar74,auVar76);
              auVar74 = vunpcklpd_avx512f(auVar75,auVar77);
              auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
              auVar77 = vunpcklpd_avx512f(auVar78,auVar80);
              auVar78 = vunpckhpd_avx512f(auVar78,auVar80);
              auVar80 = vunpcklpd_avx512f(auVar79,auVar81);
              auVar79 = vunpckhpd_avx512f(auVar79,auVar81);
              auVar81 = vshuff64x2_avx512f(auVar82,auVar77,0x88);
              auVar83 = vshuff64x2_avx512f(auVar76,auVar78,0x88);
              auVar84 = vshuff64x2_avx512f(auVar74,auVar80,0x88);
              auVar85 = vshuff64x2_avx512f(auVar75,auVar79,0x88);
              auVar77 = vshuff64x2_avx512f(auVar82,auVar77,0xdd);
              auVar76 = vshuff64x2_avx512f(auVar76,auVar78,0xdd);
              auVar78 = vshuff64x2_avx512f(auVar74,auVar80,0xdd);
              auVar75 = vshuff64x2_avx512f(auVar75,auVar79,0xdd);
              auVar79 = vshuff64x2_avx512f(auVar81,auVar83,0x88);
              auVar80 = vshuff64x2_avx512f(auVar84,auVar85,0x88);
              auVar82 = vshuff64x2_avx512f(auVar77,auVar76,0x88);
              auVar74 = vshuff64x2_avx512f(auVar78,auVar75,0x88);
              auVar81 = vshuff64x2_avx512f(auVar81,auVar83,0xdd);
              auVar83 = vshuff64x2_avx512f(auVar84,auVar85,0xdd);
              auVar76 = vshuff64x2_avx512f(auVar77,auVar76,0xdd);
              auVar75 = vshuff64x2_avx512f(auVar78,auVar75,0xdd);
              *(undefined1 (*) [64])((long)pvVar29 + lVar47 * 8 + lVar28) = auVar79;
              *(undefined1 (*) [64])((long)pvVar29 + lVar47 * 8 + lVar28 + 0x40) = auVar80;
              *(undefined1 (*) [64])((long)pvVar29 + lVar47 * 8 + lVar28 + 0x80) = auVar82;
              *(undefined1 (*) [64])((long)pvVar29 + lVar47 * 8 + lVar28 + 0xc0) = auVar74;
              *(undefined1 (*) [64])((long)pvVar29 + lVar47 * 8 + lVar28 + 0x100) = auVar81;
              *(undefined1 (*) [64])((long)pvVar29 + lVar47 * 8 + lVar28 + 0x140) = auVar83;
              *(undefined1 (*) [64])((long)pvVar29 + lVar47 * 8 + lVar28 + 0x180) = auVar76;
              *(undefined1 (*) [64])((long)pvVar29 + lVar47 * 8 + lVar28 + 0x1c0) = auVar75;
              puVar41 = puVar41 + 0x80;
              iVar22 = iVar22 + 0x10;
              lVar47 = lVar47 + 0x40;
            } while (iVar22 < (int)_w);
            lVar31 = lVar31 + lVar47;
            lVar44 = lVar44 + lVar47;
            lVar34 = lVar34 + lVar47;
            lVar25 = lVar25 + lVar47;
            lVar26 = lVar26 + lVar47;
            lVar27 = lVar27 + lVar47;
            lVar32 = lVar32 + lVar47;
            lVar47 = lVar30 + lVar47;
            uVar33 = local_110;
          }
          local_198 = (void *)((long)local_100.data + lVar27);
          lVar31 = (long)local_100.data + lVar31;
          lVar47 = (long)local_100.data + lVar47;
          lVar26 = (long)local_100.data + lVar26;
          lVar32 = (long)local_100.data + lVar32;
          lVar25 = (long)local_100.data + lVar25;
          lVar34 = (long)local_100.data + lVar34;
          lVar44 = (long)local_100.data + lVar44;
          if ((int)(uVar33 | 7) < (int)_w) {
            lVar28 = 0;
            puVar36 = puVar41;
            uVar40 = uVar33;
            do {
              auVar17 = vunpcklps_avx(*(undefined1 (*) [32])(lVar47 + lVar28),
                                      *(undefined1 (*) [32])(lVar32 + lVar28));
              auVar8 = vunpckhps_avx(*(undefined1 (*) [32])(lVar47 + lVar28),
                                     *(undefined1 (*) [32])(lVar32 + lVar28));
              auVar18 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_198 + lVar28),
                                      *(undefined1 (*) [32])(lVar26 + lVar28));
              auVar9 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_198 + lVar28),
                                     *(undefined1 (*) [32])(lVar26 + lVar28));
              auVar19 = vunpcklps_avx(*(undefined1 (*) [32])(lVar25 + lVar28),
                                      *(undefined1 (*) [32])(lVar34 + lVar28));
              auVar10 = vunpckhps_avx(*(undefined1 (*) [32])(lVar25 + lVar28),
                                      *(undefined1 (*) [32])(lVar34 + lVar28));
              auVar61 = vunpcklps_avx(*(undefined1 (*) [32])(lVar44 + lVar28),
                                      *(undefined1 (*) [32])(lVar31 + lVar28));
              auVar11 = vunpckhps_avx(*(undefined1 (*) [32])(lVar44 + lVar28),
                                      *(undefined1 (*) [32])(lVar31 + lVar28));
              auVar12 = vunpcklpd_avx(auVar17,auVar18);
              auVar17 = vunpckhpd_avx(auVar17,auVar18);
              auVar18 = vunpcklpd_avx(auVar8,auVar9);
              auVar8 = vunpckhpd_avx(auVar8,auVar9);
              auVar13 = vunpcklpd_avx(auVar19,auVar61);
              auVar9 = vunpckhpd_avx(auVar19,auVar61);
              auVar19 = vunpcklpd_avx(auVar10,auVar11);
              auVar10 = vunpckhpd_avx(auVar10,auVar11);
              auVar61._16_16_ = auVar13._0_16_;
              auVar61._0_16_ = auVar12._0_16_;
              auVar86._16_16_ = auVar9._0_16_;
              auVar86._0_16_ = auVar17._0_16_;
              auVar87._16_16_ = auVar19._0_16_;
              auVar87._0_16_ = auVar18._0_16_;
              auVar88._16_16_ = auVar10._0_16_;
              auVar88._0_16_ = auVar8._0_16_;
              auVar11 = vperm2f128_avx(auVar12,auVar13,0x31);
              auVar17 = vperm2f128_avx(auVar17,auVar9,0x31);
              auVar9 = vperm2f128_avx(auVar18,auVar19,0x31);
              auVar8 = vperm2f128_avx(auVar8,auVar10,0x31);
              *(undefined1 (*) [32])(puVar41 + lVar28 * 2) = auVar61;
              *(undefined1 (*) [32])(puVar41 + lVar28 * 2 + 8) = auVar86;
              *(undefined1 (*) [32])(puVar41 + lVar28 * 2 + 0x10) = auVar87;
              *(undefined1 (*) [32])(puVar41 + lVar28 * 2 + 0x18) = auVar88;
              *(undefined1 (*) [32])(puVar41 + lVar28 * 2 + 0x20) = auVar11;
              *(undefined1 (*) [32])(puVar41 + lVar28 * 2 + 0x28) = auVar17;
              *(undefined1 (*) [32])(puVar41 + lVar28 * 2 + 0x30) = auVar9;
              *(undefined1 (*) [32])(puVar41 + lVar28 * 2 + 0x38) = auVar8;
              puVar36 = puVar36 + 0x40;
              uVar33 = uVar40 + 8;
              iVar22 = uVar40 + 0xf;
              lVar28 = lVar28 + 0x20;
              uVar40 = uVar33;
            } while (iVar22 < (int)_w);
            lVar31 = lVar31 + lVar28;
            lVar44 = lVar44 + lVar28;
            lVar34 = lVar34 + lVar28;
            lVar25 = lVar25 + lVar28;
            lVar26 = lVar26 + lVar28;
            local_198 = (void *)((long)local_198 + lVar28);
            lVar32 = lVar32 + lVar28;
            lVar47 = lVar47 + lVar28;
            puVar41 = puVar36;
          }
          if ((int)uVar33 < (int)_w) {
            lVar28 = 0;
            do {
              *puVar41 = *(undefined4 *)(lVar47 + lVar28 * 4);
              puVar41[1] = *(undefined4 *)(lVar32 + lVar28 * 4);
              puVar41[2] = *(undefined4 *)((long)local_198 + lVar28 * 4);
              puVar41[3] = *(undefined4 *)(lVar26 + lVar28 * 4);
              puVar41[4] = *(undefined4 *)(lVar25 + lVar28 * 4);
              puVar41[5] = *(undefined4 *)(lVar34 + lVar28 * 4);
              puVar41[6] = *(undefined4 *)(lVar44 + lVar28 * 4);
              puVar41[7] = *(undefined4 *)(lVar31 + lVar28 * 4);
              puVar41 = puVar41 + 8;
              lVar28 = lVar28 + 1;
            } while (_w - uVar33 != (int)lVar28);
          }
          uVar39 = uVar38 + 0xf;
          lVar24 = lVar24 + 8;
          lVar48 = lVar48 + 8;
          lVar37 = lVar37 + 8;
          lVar43 = lVar43 + 8;
          local_158 = (void *)((long)local_158 + 8);
          local_160 = (void *)((long)local_160 + 8);
          local_168 = (void *)((long)local_168 + 8);
          local_128 = local_128 + 1;
          uVar38 = uVar38 + 8;
        } while (uVar39 < uVar49);
      }
      if (local_100.refcount == (int *)0x0) goto LAB_002b380f;
      LOCK();
      *local_100.refcount = *local_100.refcount + -1;
      UNLOCK();
      if (*local_100.refcount != 0) goto LAB_002b380f;
      if (local_100.allocator != (Allocator *)0x0) {
        (*(local_100.allocator)->_vptr_Allocator[3])();
        goto LAB_002b380f;
      }
    }
    else {
      if ((uVar33 & 3) != 0) goto LAB_002b2209;
      Mat::reshape(&local_100,local_70,_w,uVar33,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)uVar33 >> 2,0x10,4,(Allocator *)0x0);
      if (3 < (int)uVar33) {
        local_180._0_4_ = _w & 0xfffffffc;
        lVar37 = 3;
        lVar43 = 2;
        lVar48 = 1;
        local_1a0 = (void *)0x0;
        uVar38 = 0;
        do {
          lVar28 = (long)(this->weight_data_tm).w;
          pvVar29 = (this->weight_data_tm).data;
          sVar7 = (this->weight_data_tm).elemsize;
          puVar41 = (undefined4 *)((uVar38 >> 2) * lVar28 * sVar7 + (long)pvVar29);
          lVar24 = (long)local_100.w;
          if ((int)_w < 4) {
            lVar24 = local_100.elemsize * lVar24;
            lVar34 = lVar24 * uVar38;
            lVar44 = (uVar38 | 1) * lVar24;
            lVar31 = (uVar38 | 2) * lVar24;
            lVar30 = lVar24 * (uVar38 | 3);
            uVar33 = 0;
          }
          else {
            lVar30 = local_100.elemsize * lVar37 * lVar24;
            lVar31 = local_100.elemsize * lVar43 * lVar24;
            lVar44 = local_100.elemsize * lVar48 * lVar24;
            lVar24 = local_100.elemsize * uVar38 * lVar24;
            iVar22 = 3;
            lVar34 = 0;
            do {
              puVar36 = puVar41;
              auVar1 = *(undefined1 (*) [16])((long)local_100.data + lVar34 + lVar24);
              auVar2 = *(undefined1 (*) [16])((long)local_100.data + lVar34 + lVar44);
              auVar3 = *(undefined1 (*) [16])((long)local_100.data + lVar34 + lVar31);
              auVar4 = *(undefined1 (*) [16])((long)local_100.data + lVar34 + lVar30);
              auVar14 = vunpcklps_avx(auVar1,auVar2);
              auVar15 = vunpcklps_avx(auVar3,auVar4);
              auVar2 = vunpckhps_avx(auVar1,auVar2);
              auVar3 = vunpckhps_avx(auVar3,auVar4);
              auVar4 = vunpcklpd_avx(auVar14,auVar15);
              auVar1 = vunpckhpd_avx(auVar14,auVar15);
              auVar14 = vunpcklpd_avx(auVar2,auVar3);
              auVar2 = vunpckhpd_avx(auVar2,auVar3);
              puVar41 = (undefined4 *)
                        ((long)pvVar29 + lVar34 * 4 + sVar7 * (long)local_1a0 * lVar28 + 0x40);
              *(undefined1 (*) [16])(puVar41 + -0x10) = auVar4;
              *(undefined1 (*) [16])(puVar41 + -0xc) = auVar1;
              *(undefined1 (*) [16])(puVar41 + -8) = auVar14;
              *(undefined1 (*) [16])(puVar41 + -4) = auVar2;
              iVar22 = iVar22 + 4;
              lVar34 = lVar34 + 0x10;
            } while (iVar22 < (int)_w);
            puVar41 = puVar36 + 0x10;
            lVar30 = lVar30 + lVar34;
            lVar31 = lVar31 + lVar34;
            lVar44 = lVar44 + lVar34;
            lVar34 = lVar24 + lVar34;
            uVar33 = (uint)local_180;
          }
          if ((int)uVar33 < (int)_w) {
            lVar24 = 0;
            do {
              *puVar41 = *(undefined4 *)((long)local_100.data + lVar24 * 4 + lVar34);
              puVar41[1] = *(undefined4 *)((long)local_100.data + lVar24 * 4 + lVar44);
              puVar41[2] = *(undefined4 *)((long)local_100.data + lVar24 * 4 + lVar31);
              puVar41[3] = *(undefined4 *)((long)local_100.data + lVar24 * 4 + lVar30);
              puVar41 = puVar41 + 4;
              lVar24 = lVar24 + 1;
            } while (_w - uVar33 != (int)lVar24);
          }
          uVar39 = uVar38 + 7;
          lVar37 = lVar37 + 4;
          lVar43 = lVar43 + 4;
          lVar48 = lVar48 + 4;
          local_1a0 = (void *)((long)local_1a0 + 1);
          uVar38 = uVar38 + 4;
        } while (uVar39 < uVar49);
      }
      if (local_100.refcount == (int *)0x0) goto LAB_002b380f;
      LOCK();
      *local_100.refcount = *local_100.refcount + -1;
      UNLOCK();
      if (*local_100.refcount != 0) goto LAB_002b380f;
      if (local_100.allocator != (Allocator *)0x0) {
        (*(local_100.allocator)->_vptr_Allocator[3])();
        goto LAB_002b380f;
      }
    }
    if (local_100.data != (void *)0x0) {
      free(local_100.data);
    }
  }
  else {
LAB_002b2209:
    piVar5 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    piVar5 = (this->weight_data_tm).refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        pvVar29 = (this->weight_data_tm).data;
        pAVar6 = (this->weight_data_tm).allocator;
        if (pAVar6 == (Allocator *)0x0) {
          if (pvVar29 != (void *)0x0) {
            free(pvVar29);
          }
        }
        else {
          (*pAVar6->_vptr_Allocator[3])
                    (pAVar6,pvVar29,(long)iVar22 % (long)(int)uVar33 & 0xffffffff);
        }
      }
    }
    piVar5 = (this->super_InnerProduct).weight_data.refcount;
    (this->weight_data_tm).data = (this->super_InnerProduct).weight_data.data;
    (this->weight_data_tm).refcount = piVar5;
    (this->weight_data_tm).elemsize = (this->super_InnerProduct).weight_data.elemsize;
    (this->weight_data_tm).elempack = (this->super_InnerProduct).weight_data.elempack;
    (this->weight_data_tm).allocator = (this->super_InnerProduct).weight_data.allocator;
    iVar22 = (this->super_InnerProduct).weight_data.w;
    iVar20 = (this->super_InnerProduct).weight_data.h;
    iVar21 = (this->super_InnerProduct).weight_data.d;
    (this->weight_data_tm).dims = (this->super_InnerProduct).weight_data.dims;
    (this->weight_data_tm).w = iVar22;
    (this->weight_data_tm).h = iVar20;
    (this->weight_data_tm).d = iVar21;
    (this->weight_data_tm).c = (this->super_InnerProduct).weight_data.c;
    (this->weight_data_tm).cstep = (this->super_InnerProduct).weight_data.cstep;
  }
LAB_002b380f:
  if (opt->lightmode == true) {
    piVar5 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        pvVar29 = (this->super_InnerProduct).weight_data.data;
        pAVar6 = (this->super_InnerProduct).weight_data.allocator;
        if (pAVar6 == (Allocator *)0x0) {
          if (pvVar29 != (void *)0x0) {
            free(pvVar29);
          }
        }
        else {
          (*pAVar6->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_InnerProduct).weight_data.cstep = 0;
    *(undefined8 *)((long)&local_70->refcount + 4) = 0;
    *(undefined8 *)((long)&local_70->elemsize + 4) = 0;
    local_70->data = (void *)0x0;
    local_70->refcount = (int *)0x0;
    (this->super_InnerProduct).weight_data.dims = 0;
    (this->super_InnerProduct).weight_data.w = 0;
    (this->super_InnerProduct).weight_data.h = 0;
    (this->super_InnerProduct).weight_data.d = 0;
    (this->super_InnerProduct).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx512::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer_cpu(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}